

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O1

Expression __thiscall cnn::Cluster::get_bias(Cluster *this,ComputationGraph *cg)

{
  Parameters *in_RDX;
  Expression EVar1;
  ExecutionEngine *local_28;
  undefined4 local_20;
  
  if ((Parameters *)cg[2].ee != in_RDX) {
    EVar1 = expr::parameter((ComputationGraph *)&stack0xffffffffffffffd8,in_RDX);
    in_RDX = EVar1._8_8_;
    cg[2].ee = local_28;
    *(undefined4 *)
     &cg[3].nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = local_20;
  }
  (this->children).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cg[2].ee;
  *(undefined4 *)
   &(this->children).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
       *(undefined4 *)
        &cg[3].nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  EVar1._8_8_ = in_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression Cluster::get_bias(ComputationGraph& cg) const {
  if (bias.pg != &cg) {
    bias = parameter(cg, p_bias);
  }
  return bias;
}